

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

void __thiscall soplex::CLUFactorRational::eliminatePivot(CLUFactorRational *this,int prow,int pos)

{
  CLUFactorRational *this_00;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar1;
  int in_EDX;
  long lVar2;
  int in_ESI;
  long in_RDI;
  int pend;
  int plen;
  int pbeg;
  Rational pval;
  int pcol;
  int lv;
  int m;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 local_d8 [5];
  int local_c4;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [64];
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined1 *local_50;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_48;
  long local_40;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_38;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_30;
  CLUFactorRational *local_28;
  undefined1 *local_20;
  undefined4 *local_18;
  long local_10;
  undefined4 *local_8;
  
  local_70 = -1;
  local_74 = -1;
  local_50 = local_b8;
  local_60 = in_EDX;
  local_5c = in_ESI;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x21679a);
  local_bc = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)local_5c * 4);
  local_c0 = *(int *)(*(long *)(in_RDI + 0x1b0) + (long)local_5c * 4) + -1;
  *(int *)(*(long *)(in_RDI + 0x1b0) + (long)local_5c * 4) = local_c0;
  local_c4 = local_bc + local_c0;
  local_64 = local_bc + local_60;
  local_78 = *(int *)(*(long *)(in_RDI + 0x1a0) + (long)local_64 * 4);
  this_00 = (CLUFactorRational *)
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  local_20 = local_b8;
  local_28 = this_00;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              &in_stack_fffffffffffffef8->m_backend);
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x290) + (long)local_78 * 0x20) + 8) =
       *(undefined8 *)(*(long *)(in_RDI + 0x290) + 8 + (long)local_78 * 0x20);
  **(undefined8 **)(*(long *)(in_RDI + 0x290) + 8 + (long)local_78 * 0x20) =
       *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)local_78 * 0x20);
  lVar2 = *(long *)(in_RDI + 0x290) + (long)local_78 * 0x20;
  *(long *)(*(long *)(in_RDI + 0x290) + (long)local_78 * 0x20) = lVar2;
  *(long *)(*(long *)(in_RDI + 0x290) + 8 + (long)local_78 * 0x20) = lVar2;
  *(undefined4 *)(*(long *)(in_RDI + 0x1a0) + (long)local_64 * 4) =
       *(undefined4 *)(*(long *)(in_RDI + 0x1a0) + (long)local_c4 * 4);
  pnVar1 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  local_30 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  local_38 = pnVar1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              &in_stack_fffffffffffffef8->m_backend);
  *(int *)(in_RDI + 0x268) = *(int *)(in_RDI + 0x268) + 1;
  setPivot((CLUFactorRational *)
           pval.m_backend.m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           ._16_8_,pval.m_backend.m_value.num.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_data.la[1]._4_4_,
           pval.m_backend.m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[1]._0_4_,
           pval.m_backend.m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[0]._4_4_,_plen);
  if (0 < *(int *)(*(long *)(in_RDI + 0x260) + (long)local_78 * 4) + -1) {
    in_stack_ffffffffffffff04 = makeLvec(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    local_74 = in_stack_ffffffffffffff04;
  }
  for (local_64 = local_bc; local_64 < local_c4; local_64 = local_64 + 1) {
    local_68 = *(int *)(*(long *)(in_RDI + 0x1a0) + (long)local_64 * 4);
    *(undefined4 *)(*(long *)(in_RDI + 0x240) + (long)local_68 * 4) = 1;
    in_stack_fffffffffffffef8 =
         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    local_40 = *(long *)(in_RDI + 0x220) + (long)local_68 * 0x40;
    local_48 = in_stack_fffffffffffffef8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                &in_stack_fffffffffffffef8->m_backend);
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x290) + (long)local_68 * 0x20) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)local_68 * 0x20 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x290) + (long)local_68 * 0x20 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)local_68 * 0x20);
    local_70 = (*(int *)(*(long *)(in_RDI + 0x208) + (long)local_68 * 4) +
               *(int *)(*(long *)(in_RDI + 0x210) + (long)local_68 * 4)) -
               *(int *)(*(long *)(in_RDI + 0x260) + (long)local_68 * 4);
    local_6c = local_70;
    while (*(int *)(*(long *)(in_RDI + 0x1e8) + (long)local_6c * 4) != local_5c) {
      local_6c = local_6c + 1;
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x1e8) + (long)local_6c * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x1e8) + (long)local_70 * 4);
    *(int *)(*(long *)(in_RDI + 0x1e8) + (long)local_70 * 4) = local_5c;
    *(int *)(*(long *)(in_RDI + 0x260) + (long)local_68 * 4) =
         *(int *)(*(long *)(in_RDI + 0x260) + (long)local_68 * 4) + -1;
  }
  local_64 = *(int *)(*(long *)(in_RDI + 0x210) + (long)local_78 * 4) -
             *(int *)(*(long *)(in_RDI + 0x260) + (long)local_78 * 4);
  while (local_70 = *(int *)(*(long *)(in_RDI + 0x1e8) +
                            (long)(*(int *)(*(long *)(in_RDI + 0x208) + (long)local_78 * 4) +
                                  local_64) * 4), local_70 != local_5c) {
    local_74 = local_74 + 1;
    updateRow((CLUFactorRational *)
              pval.m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.data,
              pval.m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.la[0]._4_4_,
              pval.m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.capacity,
              pval.m_backend.m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ._28_4_,pval.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      ._24_4_,
              (Rational *)
              pval.m_backend.m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ._16_8_);
    local_64 = local_64 + 1;
  }
  local_70 = *(int *)(*(long *)(in_RDI + 0x210) + (long)local_78 * 4);
  while (local_64 = local_64 + 1, local_64 < local_70) {
    local_74 = local_74 + 1;
    updateRow((CLUFactorRational *)
              pval.m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.data,
              pval.m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.la[0]._4_4_,
              pval.m_backend.m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.capacity,
              pval.m_backend.m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ._28_4_,pval.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      ._24_4_,
              (Rational *)
              pval.m_backend.m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ._16_8_);
  }
  *(int *)(*(long *)(in_RDI + 0x210) + (long)local_78 * 4) =
       *(int *)(*(long *)(in_RDI + 0x210) + (long)local_78 * 4) -
       *(int *)(*(long *)(in_RDI + 0x260) + (long)local_78 * 4);
  local_64 = *(int *)(*(long *)(in_RDI + 0x1a8) + (long)local_5c * 4);
  local_c4 = local_64 + local_c0;
  for (; local_64 < local_c4; local_64 = local_64 + 1) {
    local_68 = *(int *)(*(long *)(in_RDI + 0x1a0) + (long)local_64 * 4);
    local_d8[0] = 0;
    local_10 = *(long *)(in_RDI + 0x220) + (long)local_68 * 0x40;
    local_18 = local_d8;
    local_8 = local_18;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                (longlong)in_stack_fffffffffffffef8);
    *(undefined4 *)(*(long *)(in_RDI + 0x240) + (long)local_68 * 4) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x290) + (long)local_68 * 0x20) =
         *(undefined8 *)
          (*(long *)(in_RDI + 0x298) +
          (long)*(int *)(*(long *)(in_RDI + 0x260) + (long)local_68 * 4) * 0x20);
    *(long *)(*(long *)(*(long *)(in_RDI + 0x290) + (long)local_68 * 0x20) + 8) =
         *(long *)(in_RDI + 0x290) + (long)local_68 * 0x20;
    *(long *)(*(long *)(in_RDI + 0x290) + (long)local_68 * 0x20 + 8) =
         *(long *)(in_RDI + 0x298) +
         (long)*(int *)(*(long *)(in_RDI + 0x260) + (long)local_68 * 4) * 0x20;
    *(long *)(*(long *)(in_RDI + 0x298) +
             (long)*(int *)(*(long *)(in_RDI + 0x260) + (long)local_68 * 4) * 0x20) =
         *(long *)(in_RDI + 0x290) + (long)local_68 * 0x20;
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x216f78);
  return;
}

Assistant:

inline void CLUFactorRational::eliminatePivot(int prow, int pos)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   Rational pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L vector */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working vector,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working vector and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}